

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracyProfiler.cpp
# Opt level: O2

void __thiscall tracy::Profiler::SendSingleString(Profiler *this,char *ptr,size_t len)

{
  int iVar1;
  long lVar2;
  
  if (len < 0x10000) {
    iVar1 = this->m_bufferOffset;
    if (0x40000 < (((int)len + iVar1) - this->m_bufferStart) + 3) {
      CommitData(this);
      iVar1 = this->m_bufferOffset;
    }
    this->m_buffer[iVar1] = '[';
    iVar1 = this->m_bufferOffset;
    this->m_bufferOffset = iVar1 + 1;
    *(short *)(this->m_buffer + (long)iVar1 + 1) = (short)len;
    lVar2 = (long)this->m_bufferOffset + 2;
    this->m_bufferOffset = (int)lVar2;
    memcpy(this->m_buffer + lVar2,ptr,len);
    this->m_bufferOffset = this->m_bufferOffset + (int)len;
    return;
  }
  __assert_fail("len <= std::numeric_limits<uint16_t>::max()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/tracy/client/TracyProfiler.cpp"
                ,0xb74,"void tracy::Profiler::SendSingleString(const char *, size_t)");
}

Assistant:

void Profiler::SendSingleString( const char* ptr, size_t len )
{
    QueueItem item;
    MemWrite( &item.hdr.type, QueueType::SingleStringData );

    assert( len <= std::numeric_limits<uint16_t>::max() );
    auto l16 = uint16_t( len );

    NeedDataSize( QueueDataSize[(int)QueueType::SingleStringData] + sizeof( l16 ) + l16 );

    AppendDataUnsafe( &item, QueueDataSize[(int)QueueType::SingleStringData] );
    AppendDataUnsafe( &l16, sizeof( l16 ) );
    AppendDataUnsafe( ptr, l16 );
}